

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftgloadr.c
# Opt level: O0

void FT_GlyphLoader_Rewind(FT_GlyphLoader loader)

{
  FT_GlyphLoad current;
  FT_GlyphLoad base;
  FT_GlyphLoader loader_local;
  
  (loader->base).outline.n_points = 0;
  (loader->base).outline.n_contours = 0;
  (loader->base).num_subglyphs = 0;
  memcpy(&loader->current,&loader->base,0x48);
  return;
}

Assistant:

FT_BASE_DEF( void )
  FT_GlyphLoader_Rewind( FT_GlyphLoader  loader )
  {
    FT_GlyphLoad  base    = &loader->base;
    FT_GlyphLoad  current = &loader->current;


    base->outline.n_points   = 0;
    base->outline.n_contours = 0;
    base->num_subglyphs      = 0;

    *current = *base;
  }